

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

void Fraig_PrintBinary(FILE *pFile,uint *pSign,int nBits)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar2 = nBits & 0x1f;
  iVar5 = (int)((ulong)(long)nBits >> 5) + (uint)(uVar2 != 0);
  if (0 < iVar5) {
    uVar6 = (ulong)(iVar5 - 1);
    uVar3 = uVar6;
    do {
      uVar4 = 0x1f;
      if (uVar3 == uVar6) {
        uVar4 = uVar2 - 1;
      }
      if (uVar2 == 0) {
        uVar4 = 0x1f;
      }
      if (-1 < (int)uVar4) {
        do {
          fputc(((pSign[uVar3] >> (uVar4 & 0x1f) & 1) != 0) + 0x30,(FILE *)pFile);
          bVar1 = 0 < (int)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar1);
      }
      iVar5 = (int)uVar3;
      uVar3 = uVar3 - 1;
    } while (0 < iVar5);
  }
  return;
}

Assistant:

void Fraig_PrintBinary( FILE * pFile, unsigned * pSign, int nBits )
{
    int Remainder, nWords;
    int w, i;

    Remainder = (nBits%(sizeof(unsigned)*8));
    nWords    = (nBits/(sizeof(unsigned)*8)) + (Remainder>0);

    for ( w = nWords-1; w >= 0; w-- )
        for ( i = ((w == nWords-1 && Remainder)? Remainder-1: 31); i >= 0; i-- )
            fprintf( pFile, "%c", '0' + (int)((pSign[w] & (1<<i)) > 0) );

//  fprintf( pFile, "\n" );
}